

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O3

void __thiscall density::lifo_buffer::~lifo_buffer(lifo_buffer *this)

{
  void *i_block;
  size_t sVar1;
  long *in_FS_OFFSET;
  
  i_block = this->m_data;
  sVar1 = this->m_size;
  detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  if ((in_FS_OFFSET[-0x19] ^ (ulong)i_block) < 0x10000) {
    in_FS_OFFSET[-0x19] = (long)i_block;
    return;
  }
  lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::deallocate_slow_path
            ((lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)
             (*in_FS_OFFSET + -200),i_block,sVar1 + 7 & 0xfffffffffffffff8);
  return;
}

Assistant:

~lifo_buffer()
        {
            detail::ThreadLifoAllocator<>::deallocate(m_data, uint_upper_align(m_size, alignment));
        }